

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O0

void __thiscall Table::define_column_type(Table *this,int cnt,types tp)

{
  reference pvVar1;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_types,_int>_> *p_Var2;
  size_type sVar3;
  __tuple_element_t<2UL,_tuple<basic_string<char>,_types,_int>_> *p_Var4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  vector<double,_std::allocator<double>_> local_a8;
  pair<int,_std::vector<double,_std::allocator<double>_>_> local_88;
  vector<long_long,_std::allocator<long_long>_> local_58;
  pair<int,_std::vector<long_long,_std::allocator<long_long>_>_> local_38;
  types local_18;
  int local_14;
  types tp_local;
  int cnt_local;
  Table *this_local;
  
  local_18 = tp;
  local_14 = cnt;
  _tp_local = this;
  pvVar1 = std::
           vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
           ::operator[](&this->columns,(long)cnt);
  p_Var2 = std::get<1ul,std::__cxx11::string,Table::types,int>(pvVar1);
  *p_Var2 = tp;
  if (local_18 == STRING) {
    sVar3 = std::
            vector<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::size(&this->string_cols);
    pvVar1 = std::
             vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
             ::operator[](&this->columns,(long)local_14);
    p_Var4 = std::get<2ul,std::__cxx11::string,Table::types,int>(pvVar1);
    *p_Var4 = (__tuple_element_t<2UL,_tuple<basic_string<char>,_types,_int>_>)sVar3;
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_e8);
    std::
    pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pair<int_&,_true>(&local_c8,&local_14,&local_e8);
    std::
    vector<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::push_back(&this->string_cols,&local_c8);
    std::
    pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~pair(&local_c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_e8);
  }
  else if (local_18 == INT) {
    sVar3 = std::
            vector<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
            ::size(&this->int_cols);
    pvVar1 = std::
             vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
             ::operator[](&this->columns,(long)local_14);
    p_Var4 = std::get<2ul,std::__cxx11::string,Table::types,int>(pvVar1);
    *p_Var4 = (__tuple_element_t<2UL,_tuple<basic_string<char>,_types,_int>_>)sVar3;
    local_58.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<long_long,_std::allocator<long_long>_>::vector(&local_58);
    std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>::pair<int_&,_true>
              (&local_38,&local_14,&local_58);
    std::
    vector<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
    ::push_back(&this->int_cols,&local_38);
    std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>::~pair(&local_38);
    std::vector<long_long,_std::allocator<long_long>_>::~vector(&local_58);
  }
  else {
    if (local_18 != FLOAT) {
      std::operator<<((ostream *)&std::cerr,"Trying to define_column_type to UNDEFINED\n");
      exit(1);
    }
    sVar3 = std::
            vector<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
            ::size(&this->float_cols);
    pvVar1 = std::
             vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
             ::operator[](&this->columns,(long)local_14);
    p_Var4 = std::get<2ul,std::__cxx11::string,Table::types,int>(pvVar1);
    *p_Var4 = (__tuple_element_t<2UL,_tuple<basic_string<char>,_types,_int>_>)sVar3;
    local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector(&local_a8);
    std::pair<int,_std::vector<double,_std::allocator<double>_>_>::pair<int_&,_true>
              (&local_88,&local_14,&local_a8);
    std::
    vector<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
    ::push_back(&this->float_cols,&local_88);
    std::pair<int,_std::vector<double,_std::allocator<double>_>_>::~pair(&local_88);
    std::vector<double,_std::allocator<double>_>::~vector(&local_a8);
  }
  return;
}

Assistant:

void Table::define_column_type(int cnt, types tp){
    std::get<1>(columns[cnt]) = tp;
    switch (tp) {
        case INT:
            std::get<2>(columns[cnt]) = int_cols.size();
            int_cols.push_back({cnt, {}});
            break;
        case FLOAT:
            std::get<2>(columns[cnt]) = float_cols.size();
            float_cols.push_back({cnt, {}});
            break;
        case STRING:
            std::get<2>(columns[cnt]) = string_cols.size();
            string_cols.push_back({cnt, {}});
            break;
        default:
            std::cerr << "Trying to define_column_type to UNDEFINED\n";
            exit(EXIT_FAILURE);
    }
}